

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

_Bool Curl_creader_needs_rewind(Curl_easy *data)

{
  _Bool _Var1;
  Curl_creader *local_20;
  Curl_creader *reader;
  Curl_easy *data_local;
  
  local_20 = (data->req).reader_stack;
  while( true ) {
    if (local_20 == (Curl_creader *)0x0) {
      return false;
    }
    _Var1 = (*local_20->crt->needs_rewind)(data,local_20);
    if (_Var1) break;
    local_20 = local_20->next;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"client reader needs rewind before next request");
  }
  return true;
}

Assistant:

bool Curl_creader_needs_rewind(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  while(reader) {
    if(reader->crt->needs_rewind(data, reader)) {
      CURL_TRC_READ(data, "client reader needs rewind before next request");
      return TRUE;
    }
    reader = reader->next;
  }
  return FALSE;
}